

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::GenStruct(JsonPrinter *this,StructDef *struct_def,Table *table,int indent)

{
  FieldDef *fd;
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  Table *prev_val;
  pointer ppFVar7;
  bool bVar8;
  bool bVar9;
  char *local_40;
  
  std::__cxx11::string::push_back((char)this->text);
  iVar3 = this->opts->indent_step;
  iVar4 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  ppFVar7 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar8 = ppFVar7 ==
          (struct_def->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar8) {
    iVar3 = iVar3 + indent;
    prev_val = (Table *)0x0;
    do {
      fd = *ppFVar7;
      bVar9 = true;
      if (struct_def->fixed == false) {
        uVar2 = (fd->value).offset;
        if (uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
          bVar9 = *(short *)(table + ((ulong)uVar2 - (long)*(int *)table)) != 0;
        }
        else {
          bVar9 = false;
        }
      }
      if (((this->opts->output_default_scalars_in_json == false) && (fd->key != true)) ||
         (0xb < (fd->value).type.base_type - BASE_TYPE_UTYPE)) {
        bVar6 = 0;
      }
      else {
        bVar6 = fd->deprecated ^ 1;
      }
      bVar1 = true;
      if (bVar9 || (bVar6 & 1) != 0) {
        if ((iVar4 != 0) && (this->opts->protobuf_ascii_alike == false)) {
          std::__cxx11::string::push_back((char)this->text);
        }
        if (-1 < this->opts->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this->text,this->text->_M_string_length,0,(char)iVar3);
        OutputIdentifier(this,(string *)fd);
        if ((this->opts->protobuf_ascii_alike != true) ||
           (((fd->value).type.base_type & ~BASE_TYPE_UTYPE) != BASE_TYPE_VECTOR)) {
          std::__cxx11::string::push_back((char)this->text);
        }
        iVar4 = iVar4 + 1;
        std::__cxx11::string::push_back((char)this->text);
        switch((fd->value).type.base_type) {
        case BASE_TYPE_NONE:
        case BASE_TYPE_UTYPE:
        case BASE_TYPE_BOOL:
        case BASE_TYPE_UCHAR:
          GenField<unsigned_char>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_CHAR:
          GenField<signed_char>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_SHORT:
          GenField<short>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_USHORT:
          GenField<unsigned_short>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_INT:
          GenField<int>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_UINT:
          GenField<unsigned_int>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_LONG:
          GenField<long>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_ULONG:
          GenField<unsigned_long>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_FLOAT:
          GenField<float>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_DOUBLE:
          GenField<double>(this,fd,table,struct_def->fixed,iVar3);
          break;
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_UNION:
        case BASE_TYPE_ARRAY:
        case BASE_TYPE_VECTOR64:
          pcVar5 = GenFieldOffset(this,fd,table,struct_def->fixed,iVar3,(uint8_t *)prev_val);
          if (pcVar5 != (char *)0x0) {
            bVar1 = false;
            local_40 = pcVar5;
            goto LAB_0014792b;
          }
        }
        uVar2 = (fd->value).offset;
        bVar1 = true;
        if (struct_def->fixed == true) {
          prev_val = table + uVar2;
        }
        else {
          if (uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
            uVar2 = *(ushort *)(table + ((ulong)uVar2 - (long)*(int *)table));
          }
          else {
            uVar2 = 0;
          }
          prev_val = (Table *)0x0;
          if (uVar2 != 0) {
            prev_val = table + uVar2;
          }
        }
      }
LAB_0014792b:
      if (!bVar1) break;
      ppFVar7 = ppFVar7 + 1;
      bVar8 = ppFVar7 ==
              (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar8);
  }
  if (bVar8) {
    if (-1 < this->opts->indent_step) {
      std::__cxx11::string::push_back((char)this->text);
    }
    local_40 = (char *)0x0;
    std::__cxx11::string::_M_replace_aux
              ((ulong)this->text,this->text->_M_string_length,0,(char)indent);
    std::__cxx11::string::push_back((char)this->text);
  }
  return local_40;
}

Assistant:

const char *GenStruct(const StructDef &struct_def, const Table *table,
                        int indent) {
    text += '{';
    int fieldout = 0;
    const uint8_t *prev_val = nullptr;
    const auto elem_indent = indent + Indent();
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &fd = **it;
      auto is_present = struct_def.fixed || table->CheckField(fd.value.offset);
      auto output_anyway = (opts.output_default_scalars_in_json || fd.key) &&
                           IsScalar(fd.value.type.base_type) && !fd.deprecated;
      if (is_present || output_anyway) {
        if (fieldout++) { AddComma(); }
        AddNewLine();
        AddIndent(elem_indent);
        OutputIdentifier(fd.name);
        if (!opts.protobuf_ascii_alike ||
            (fd.value.type.base_type != BASE_TYPE_STRUCT &&
             fd.value.type.base_type != BASE_TYPE_VECTOR))
          text += ':';
        text += ' ';
        // clang-format off
        switch (fd.value.type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            GenField<CTYPE>(fd, table, struct_def.fixed, elem_indent); \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, ...) \
          case BASE_TYPE_ ## ENUM:
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
              FLATBUFFERS_GEN_TYPE_ARRAY(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            {
              auto err = GenFieldOffset(fd, table, struct_def.fixed, elem_indent, prev_val);
              if (err) return err;
              break;
            }
        }
        // clang-format on
        // Track prev val for use with union types.
        if (struct_def.fixed) {
          prev_val = reinterpret_cast<const uint8_t *>(table) + fd.value.offset;
        } else {
          prev_val = table->GetAddressOf(fd.value.offset);
        }
      }
    }
    AddNewLine();
    AddIndent(indent);
    text += '}';
    return nullptr;
  }